

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O3

int AF_A_MageAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  AActor *pAVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  uint uVar8;
  AActor *actor;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  bool bVar11;
  FSoundID local_44;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e830c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor == (AActor *)0x0) {
LAB_005e817e:
        actor = (AActor *)0x0;
        pVVar9 = param;
        uVar8 = numparam;
      }
      else {
        pPVar7 = (actor->super_DThinker).super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar6 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
          (actor->super_DThinker).super_DObject.Class = pPVar7;
        }
        bVar10 = pPVar7 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        bVar11 = pPVar7 == pPVar5;
        if (!bVar11 && !bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
        uVar8 = (uint)bVar10;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e830c;
        }
      }
      pPVar5 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e823e;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_005e82fc;
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar7 = (PClass *)puVar3[1];
            if (pPVar7 == (PClass *)0x0) {
              pPVar7 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar9,uVar8,ret);
              puVar3[1] = pPVar7;
            }
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar5 && bVar10) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar10 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar5) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e830c;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_005e82fc;
      }
      if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e823e:
        pAVar4 = (actor->target).field_0.p;
        if (pAVar4 != (AActor *)0x0) {
          if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            dVar1 = (actor->Angles).Yaw.Degrees;
            local_30.Degrees = dVar1;
            MStaffSpawn2(actor,&local_30);
            local_38.Degrees = dVar1 + -5.0;
            MStaffSpawn2(actor,&local_38);
            local_40.Degrees = dVar1 + 5.0;
            MStaffSpawn2(actor,&local_40);
            local_44.ID = S_FindSound("MageStaffFire");
            S_Sound(actor,1,&local_44,1.0,1.0);
          }
          else {
            (actor->target).field_0.p = (AActor *)0x0;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e830c;
    }
    if (actor == (AActor *)0x0) goto LAB_005e817e;
  }
LAB_005e82fc:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e830c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MageAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (self->target == NULL)
	{
		return 0;
	}
	DAngle angle = self->Angles.Yaw;
	MStaffSpawn2(self, angle);
	MStaffSpawn2(self, angle - 5);
	MStaffSpawn2(self, angle + 5);
	S_Sound(self, CHAN_WEAPON, "MageStaffFire", 1, ATTN_NORM);
	return 0;
}